

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

bool google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion
               (char *begin,int overrun,int depth)

{
  uint32_t uVar1;
  string *psVar2;
  size_type sVar3;
  pointer pcVar4;
  char *pcVar5;
  undefined8 uStack_60;
  char *ptr;
  uint32_t tag;
  uint64_t val;
  
  psVar2 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(overrun,0,"overrun >= 0");
  if (psVar2 == (string *)0x0) {
    psVar2 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (overrun,0x10,"overrun <= kSlopBytes");
    if (psVar2 == (string *)0x0) {
      ptr = begin + overrun;
      pcVar5 = begin + 0x10;
      do {
        if (pcVar5 <= ptr) {
          return false;
        }
        ptr = ReadTag(ptr,&tag,0);
        if (ptr == (char *)0x0) {
          return false;
        }
        if (pcVar5 < ptr) {
          return false;
        }
        if (tag == 0) {
          return true;
        }
        switch(tag & 7) {
        case 0:
          ptr = VarintParse<unsigned_long>(ptr,&val);
          if (ptr == (char *)0x0) {
LAB_00169ff3:
            return false;
          }
          break;
        case 1:
          ptr = ptr + 8;
          break;
        case 2:
          uVar1 = ReadSize(&ptr);
          if (ptr == (char *)0x0) {
            return false;
          }
          if ((long)pcVar5 - (long)ptr < (long)(int)uVar1) {
            return false;
          }
          ptr = ptr + (int)uVar1;
          break;
        case 3:
          depth = depth + 1;
          break;
        case 4:
          if (depth < 1) {
            return true;
          }
          depth = depth + -1;
          break;
        case 5:
          ptr = ptr + 4;
          break;
        default:
          goto LAB_00169ff3;
        }
      } while( true );
    }
    pcVar4 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uStack_60 = 0x21;
  }
  else {
    pcVar4 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uStack_60 = 0x20;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.cc"
             ,uStack_60,sVar3,pcVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}